

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void recomputeColumnsNotIndexed(Index *pIdx)

{
  short sVar1;
  uint local_1c;
  int x;
  int j;
  Bitmask m;
  Index *pIdx_local;
  
  _x = 0;
  local_1c = (uint)pIdx->nColumn;
  while (local_1c = local_1c - 1, -1 < (int)local_1c) {
    sVar1 = pIdx->aiColumn[(int)local_1c];
    if ((-1 < sVar1) && (sVar1 < 0x3f)) {
      _x = 1L << ((byte)sVar1 & 0x3f) | _x;
    }
  }
  pIdx->colNotIdxed = _x ^ 0xffffffffffffffff;
  return;
}

Assistant:

static void recomputeColumnsNotIndexed(Index *pIdx){
  Bitmask m = 0;
  int j;
  for(j=pIdx->nColumn-1; j>=0; j--){
    int x = pIdx->aiColumn[j];
    if( x>=0 ){
      testcase( x==BMS-1 );
      testcase( x==BMS-2 );
      if( x<BMS-1 ) m |= MASKBIT(x);
    }
  }
  pIdx->colNotIdxed = ~m;
  assert( (pIdx->colNotIdxed>>63)==1 );
}